

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O0

void __thiscall warning_suppressor::restore(warning_suppressor *this)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  size_t new_errors;
  size_t new_warnings;
  
  if (*(long *)(in_RDI + 0x178) != 0) {
    set_streambuf((streambuf *)0x17b2e3);
    *(undefined8 *)(in_RDI + 0x178) = 0;
    lVar1 = logger::total_warnings - *(long *)(in_RDI + 0x180);
    lVar2 = logger::total_errors - *(long *)(in_RDI + 0x188);
    logger::total_warnings = *(size_t *)(in_RDI + 0x180);
    logger::total_errors = *(size_t *)(in_RDI + 0x188);
    *(long *)(in_RDI + 0x180) = lVar1;
    *(long *)(in_RDI + 0x188) = lVar2;
  }
  return;
}

Assistant:

void restore() {
		
		if(!streambuf) {
			return;
		}
		
		set_streambuf(streambuf);
		streambuf = NULL;
		
		size_t new_warnings = logger::total_warnings - warnings;
		size_t new_errors = logger::total_errors - errors;
		logger::total_warnings = warnings;
		logger::total_errors = errors;
		warnings = new_warnings;
		errors = new_errors;
		
	}